

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MADEC-CORE.cpp
# Opt level: O0

void add2C(int v)

{
  bool bVar1;
  bool local_64;
  bool local_62;
  undefined1 local_60 [32];
  undefined1 local_40 [16];
  undefined1 local_30 [28];
  int u_1;
  int _p__1;
  int u;
  int _p_;
  int v_local;
  
  u = v;
  std::bitset<15000UL>::reset(&P,(long)v);
  sizeP = sizeP + -1;
  if (CE_P_[u] < 1) {
    std::bitset<15000UL>::set(&Cm,(long)u,true);
    in_Cm(u);
  }
  else {
    std::bitset<15000UL>::set(&Cp,(long)u,true);
    in_Cp(u);
  }
  sizeC = sizeC + 1;
  CE_P_P = CE_P_P - CE_P_[u];
  cnt_lP = cnt_lP + -1;
  _p__1 = AdjP[u];
  u_1 = AdjB[_p__1];
  while (_p__1 < AdjP[u + 1]) {
    neiC[u_1] = neiC[u_1] + 1;
    neiP[u_1] = neiP[u_1] + -1;
    _p__1 = _p__1 + 1;
    u_1 = AdjB[_p__1];
  }
  local_30._24_4_ = NAdjP[u];
  local_30._20_4_ = NAdjB[(int)local_30._24_4_];
  while ((int)local_30._24_4_ < NAdjP[u + 1]) {
    CE_P_[(int)local_30._20_4_] = CE_P_[(int)local_30._20_4_] + -1;
    std::bitset<15000UL>::operator[]((bitset<15000UL> *)local_30,0x52b91d0);
    bVar1 = std::bitset::reference::operator_cast_to_bool((reference *)local_30);
    local_60[0x13] = 0;
    local_62 = true;
    if (!bVar1) {
      std::bitset<15000UL>::operator[]((bitset<15000UL> *)local_40,0x52b8a78);
      local_60[0x13] = 1;
      local_62 = std::bitset::reference::operator_cast_to_bool((reference *)local_40);
    }
    if ((local_60[0x13] & 1) != 0) {
      std::bitset<15000UL>::reference::~reference((reference *)local_40);
    }
    std::bitset<15000UL>::reference::~reference((reference *)local_30);
    if (local_62 != false) {
      CE_Cp_P = CE_Cp_P + -1;
    }
    local_64 = false;
    if (CE_P_[(int)local_30._20_4_] == 0) {
      std::bitset<15000UL>::operator[]((bitset<15000UL> *)local_60,0x52b91d0);
      local_64 = std::bitset::reference::operator_cast_to_bool((reference *)local_60);
      std::bitset<15000UL>::reference::~reference((reference *)local_60);
    }
    if (local_64 != false) {
      add_from_Cp_to_Cm(local_30._20_4_);
    }
    local_30._24_4_ = local_30._24_4_ + 1;
    local_30._20_4_ = NAdjB[(int)local_30._24_4_];
  }
  return;
}

Assistant:

inline void add2C(int v) {
    P.reset(v); --sizeP;
    if (CE_P_[v] > 0) {Cp.set(v); in_Cp(v);}
    else {Cm.set(v); in_Cm(v);}
    ++sizeC;

    CE_P_P -= CE_P_[v];
    --cnt_lP;

    FOR_NA(v, u) {++neiC[u]; --neiP[u];}

    FOR_C_NA(v, u) {
        --CE_P_[u];
        if (Cp[u] || Cm[u]) --CE_Cp_P;
        if (CE_P_[u] == 0 && Cp[u])
            add_from_Cp_to_Cm(u);
    }
}